

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdfastpfor.h
# Opt level: O0

void __thiscall
FastPForLib::SIMDFastPFor<4U>::__decodeArray
          (SIMDFastPFor<4U> *this,uint32_t *in,size_t *length,uint32_t *out,size_t nvalue)

{
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>
  *p_Var1;
  uint *puVar2;
  reference puVar3;
  long in_RCX;
  byte *pbVar4;
  long *in_RDX;
  uint *in_RSI;
  long in_RDI;
  ulong in_R8;
  uint8_t pos_1;
  uint32_t k_3;
  const_iterator *exceptionsptr;
  uint8_t pos;
  uint32_t k_2;
  uint8_t maxbits;
  uint8_t cexcept;
  uint8_t b;
  uint32_t run;
  uint32_t k_1;
  const_iterator unpackpointers [33];
  uint32_t k;
  uint32_t bitmap;
  uint8_t *bytep;
  uint32_t bytesize;
  uint32_t *inexcept;
  uint32_t wheremeta;
  uint32_t *headerin;
  uint32_t *initin;
  vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
  *in_stack_fffffffffffffe28;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>
  *this_00;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>
  *local_1c0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>
  local_1a8;
  byte local_19d;
  uint local_19c;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>
  *local_198;
  byte local_18d;
  uint local_18c;
  byte local_187;
  byte local_186;
  byte local_185;
  uint local_184;
  uint *local_180;
  uint *local_178;
  uint local_16c;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>
  local_168 [9];
  uint32_t in_stack_fffffffffffffee4;
  vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
  *in_stack_fffffffffffffee8;
  uint32_t *in_stack_fffffffffffffef0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>
  local_60;
  uint *local_58;
  uint local_4c;
  uint32_t *local_48;
  uint local_3c;
  uint *local_30;
  ulong local_28;
  long local_20;
  long *local_18;
  uint *local_10;
  
  local_10 = in_RSI + 1;
  local_3c = *in_RSI;
  local_58 = in_RSI + local_3c + 1;
  local_4c = in_RSI[local_3c];
  puVar2 = (uint *)(((ulong)local_4c + 3 & 0xfffffffffffffffc) + (long)local_58);
  local_48 = puVar2 + 1;
  local_60._M_current._4_4_ = *puVar2;
  local_30 = in_RSI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  for (local_60._M_current._0_4_ = 2; (uint)local_60._M_current < 0x21;
      local_60._M_current._0_4_ = (uint)local_60._M_current + 1) {
    if ((local_60._M_current._4_4_ & 1 << ((char)(uint)local_60._M_current - 1U & 0x1f)) != 0) {
      std::
      vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
      ::operator[]((vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                    *)(in_RDI + 0x10),(ulong)(uint)local_60._M_current);
      local_48 = SIMDFastPFor<4u>::
                 unpackmesimd<std::vector<unsigned_int,FastPForLib::AlignedSTLAllocator<unsigned_int,64ul>>>
                           (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                            in_stack_fffffffffffffee4);
    }
  }
  *local_18 = (long)local_48 - (long)local_30 >> 2;
  this_00 = &local_60;
  p_Var1 = local_168;
  do {
    local_1c0 = p_Var1;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>
    ::__normal_iterator(local_1c0);
    p_Var1 = local_1c0 + 1;
  } while (local_1c0 + 1 != this_00);
  for (local_16c = 1; local_16c < 0x21; local_16c = local_16c + 1) {
    std::
    vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
    ::operator[]((vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                  *)(in_RDI + 0x10),(ulong)local_16c);
    local_180 = (uint *)std::
                        vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                        ::begin(in_stack_fffffffffffffe28);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,FastPForLib::AlignedSTLAllocator<unsigned_int,64ul>>>
    ::__normal_iterator<unsigned_int*>
              (local_1c0,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>
                *)in_stack_fffffffffffffe28);
    local_168[local_16c]._M_current = local_178;
  }
  for (local_184 = 0; (ulong)local_184 < local_28 >> 7; local_184 = local_184 + 1) {
    pbVar4 = (byte *)((long)local_58 + 1);
    local_185 = (byte)*local_58;
    local_58 = (uint *)((long)local_58 + 2);
    local_186 = *pbVar4;
    local_10 = unpackblocksimd((uint32_t *)local_1c0,(uint32_t *)in_stack_fffffffffffffe28,0);
    if (local_186 != 0) {
      local_187 = (byte)*local_58;
      if ((uint)local_187 - (uint)local_185 == 1) {
        local_58 = (uint *)((long)local_58 + 1);
        for (local_18c = 0; local_18c < local_186; local_18c = local_18c + 1) {
          local_18d = (byte)*local_58;
          *(uint *)(local_20 + (ulong)local_18d * 4) =
               1 << (local_185 & 0x1f) | *(uint *)(local_20 + (ulong)local_18d * 4);
          local_58 = (uint *)((long)local_58 + 1);
        }
      }
      else {
        local_198 = local_168 + (int)((uint)local_187 - (uint)local_185);
        local_58 = (uint *)((long)local_58 + 1);
        for (local_19c = 0; local_19c < local_186; local_19c = local_19c + 1) {
          local_19d = (byte)*local_58;
          local_58 = (uint *)((long)local_58 + 1);
          local_1a8 = __gnu_cxx::
                      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>
                      ::operator++(this_00,(int)((ulong)local_1c0 >> 0x20));
          puVar3 = __gnu_cxx::
                   __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>
                   ::operator*(&local_1a8);
          *(uint *)(local_20 + (ulong)local_19d * 4) =
               *puVar3 << (local_185 & 0x1f) | *(uint *)(local_20 + (ulong)local_19d * 4);
        }
      }
    }
    local_20 = local_20 + 0x200;
  }
  return;
}

Assistant:

void __decodeArray(const uint32_t *in, size_t &length, uint32_t *out,
                     const size_t nvalue) {
    const uint32_t *const initin = in;
    const uint32_t *const headerin = in++;
    const uint32_t wheremeta = headerin[0];
    const uint32_t *inexcept = headerin + wheremeta;
    const uint32_t bytesize = *inexcept++;
    const uint8_t *bytep = reinterpret_cast<const uint8_t *>(inexcept);
    inexcept += (bytesize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    const uint32_t bitmap = *(inexcept++);
    for (uint32_t k = 2; k <= 32; ++k) {
      if ((bitmap & (1U << (k - 1))) != 0) {
        inexcept = unpackmesimd(inexcept, datatobepacked[k], k);
      }
    }
    length = inexcept - initin;
    std::vector<uint32_t, cacheallocator>::const_iterator
        unpackpointers[32 + 1];
    for (uint32_t k = 1; k <= 32; ++k) {
      unpackpointers[k] = datatobepacked[k].begin();
    }
    for (uint32_t run = 0; run < nvalue / BlockSize; ++run, out += BlockSize) {
      const uint8_t b = *bytep++;
      const uint8_t cexcept = *bytep++;
      in = unpackblocksimd(in, out, b);
      if (cexcept > 0) {
        const uint8_t maxbits = *bytep++;
        if (maxbits - b == 1) {
          for (uint32_t k = 0; k < cexcept; ++k) {
            const uint8_t pos = *(bytep++);
            out[pos] |= static_cast<uint32_t>(1) << b;
          }
        } else {
          std::vector<uint32_t, cacheallocator>::const_iterator &exceptionsptr =
              unpackpointers[maxbits - b];
          for (uint32_t k = 0; k < cexcept; ++k) {
            const uint8_t pos = *(bytep++);
            out[pos] |= (*(exceptionsptr++)) << b;
          }
        }
      }
    }
    assert(in == headerin + wheremeta);
  }